

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

string * __thiscall
flatbuffers::dart::DartGenerator::GenDartTypeName
          (string *__return_storage_ptr__,DartGenerator *this,Type *type,
          Namespace *current_namespace,FieldDef *def,string *struct_type_suffix)

{
  BaseType BVar1;
  EnumDef *pEVar2;
  pointer pcVar3;
  long lVar4;
  long *plVar5;
  size_type *psVar6;
  char *pcVar7;
  char *pcVar8;
  string local_b0;
  string local_90;
  string local_70;
  Type local_50;
  
  pEVar2 = type->enum_def;
  BVar1 = type->base_type;
  if (pEVar2 == (EnumDef *)0x0) {
    switch(BVar1) {
    case BASE_TYPE_BOOL:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "bool";
      pcVar7 = "";
      break;
    case BASE_TYPE_CHAR:
    case BASE_TYPE_UCHAR:
    case BASE_TYPE_SHORT:
    case BASE_TYPE_USHORT:
    case BASE_TYPE_INT:
    case BASE_TYPE_UINT:
    case BASE_TYPE_LONG:
    case BASE_TYPE_ULONG:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "int";
      pcVar7 = "";
      break;
    case BASE_TYPE_FLOAT:
    case BASE_TYPE_DOUBLE:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "double";
      pcVar7 = "";
      break;
    case BASE_TYPE_STRING:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "String";
      pcVar7 = "";
      break;
    case BASE_TYPE_VECTOR:
      goto switchD_001d11ea_caseD_e;
    case BASE_TYPE_STRUCT:
      (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_90,&this->namer_,type->struct_def);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_90,(ulong)(struct_type_suffix->_M_dataplus)._M_p);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_b0.field_2._M_allocated_capacity = *psVar6;
        local_b0.field_2._8_8_ = plVar5[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar6;
        local_b0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      MaybeWrapNamespace(__return_storage_ptr__,this,&local_b0,current_namespace,def);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_001d14e5;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_dart.cpp"
                    ,0x18b,
                    "std::string flatbuffers::dart::DartGenerator::GenDartTypeName(const Type &, Namespace *, const FieldDef &, std::string)"
                   );
    }
LAB_001d1425:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
    return __return_storage_ptr__;
  }
  if ((BVar1 != BASE_TYPE_UNION & pEVar2->is_union) == 1) {
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_b0,&this->namer_);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      lVar4 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_90.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
    local_90._M_dataplus._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001d14e5;
  }
  if (pEVar2->is_union != false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "dynamic";
    pcVar7 = "";
    goto LAB_001d1425;
  }
  if (BVar1 != BASE_TYPE_VECTOR) {
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(__return_storage_ptr__,&this->namer_);
    return __return_storage_ptr__;
  }
switchD_001d11ea_caseD_e:
  local_50.base_type = type->element;
  local_50.struct_def = type->struct_def;
  local_50.fixed_length = type->fixed_length;
  local_50.element = BASE_TYPE_NONE;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar3 = (struct_type_suffix->_M_dataplus)._M_p;
  local_50.enum_def = pEVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + struct_type_suffix->_M_string_length);
  GenDartTypeName(&local_90,this,&local_50,current_namespace,def,&local_70);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x36578c);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_b0.field_2._M_allocated_capacity = *psVar6;
    local_b0.field_2._8_8_ = plVar5[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar6;
    local_b0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar4 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
  local_90._M_dataplus._M_p = local_70._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return __return_storage_ptr__;
  }
LAB_001d14e5:
  operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string GenDartTypeName(const Type &type, Namespace *current_namespace,
                              const FieldDef &def,
                              std::string struct_type_suffix = "") {
    if (type.enum_def) {
      if (type.enum_def->is_union && type.base_type != BASE_TYPE_UNION) {
        return namer_.Type(*type.enum_def) + "TypeId";
      } else if (type.enum_def->is_union) {
        return "dynamic";
      } else if (type.base_type != BASE_TYPE_VECTOR) {
        return namer_.Type(*type.enum_def);
      }
    }

    switch (type.base_type) {
      case BASE_TYPE_BOOL: return "bool";
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG:
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT:
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT:
      case BASE_TYPE_CHAR:
      case BASE_TYPE_UCHAR: return "int";
      case BASE_TYPE_FLOAT:
      case BASE_TYPE_DOUBLE: return "double";
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_STRUCT:
        return MaybeWrapNamespace(
            namer_.Type(*type.struct_def) + struct_type_suffix,
            current_namespace, def);
      case BASE_TYPE_VECTOR:
        return "List<" +
               GenDartTypeName(type.VectorType(), current_namespace, def,
                               struct_type_suffix) +
               ">";
      default: assert(0); return "dynamic";
    }
  }